

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.hpp
# Opt level: O2

int16_t duckdb::TryAbsOperator::Operation<short,short>(int16_t input)

{
  short sVar1;
  OutOfRangeException *this;
  allocator local_39;
  string local_38;
  
  if (input != -0x8000) {
    sVar1 = -input;
    if (0 < input) {
      sVar1 = input;
    }
    return sVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Overflow on abs(%d)",&local_39);
  OutOfRangeException::OutOfRangeException<short>(this,&local_38,-0x8000);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline int16_t TryAbsOperator::Operation(int16_t input) {
	if (input == NumericLimits<int16_t>::Minimum()) {
		throw OutOfRangeException("Overflow on abs(%d)", input);
	}
	return AbsOperator::Operation<int16_t, int16_t>(input);
}